

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int program_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *upstream)

{
  long lVar1;
  void *__s1;
  long *in_RDI;
  char *p;
  program_bidder *state;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  lVar1 = *in_RDI;
  if (*(long *)(lVar1 + 0x18) == 0) {
    if (*(int *)(lVar1 + 0x20) == 0) {
      *(undefined4 *)(lVar1 + 0x20) = 1;
      iVar2 = 0x7fffffff;
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    __s1 = __archive_read_filter_ahead
                     ((archive_read_filter *)state,(size_t)p,
                      (ssize_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (__s1 == (void *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = memcmp(__s1,*(void **)(lVar1 + 0x10),*(size_t *)(lVar1 + 0x18));
      if (iVar2 == 0) {
        iVar2 = (int)*(undefined8 *)(lVar1 + 0x18) << 3;
      }
      else {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
program_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *upstream)
{
	struct program_bidder *state = self->data;
	const char *p;

	/* If we have a signature, use that to match. */
	if (state->signature_len > 0) {
		p = __archive_read_filter_ahead(upstream,
		    state->signature_len, NULL);
		if (p == NULL)
			return (0);
		/* No match, so don't bid. */
		if (memcmp(p, state->signature, state->signature_len) != 0)
			return (0);
		return ((int)state->signature_len * 8);
	}

	/* Otherwise, bid once and then never bid again. */
	if (state->inhibit)
		return (0);
	state->inhibit = 1;
	return (INT_MAX);
}